

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O0

uint32_t utf8_encode(char *buffer,uint32_t value)

{
  byte bVar1;
  char *bytes;
  uint32_t value_local;
  char *buffer_local;
  
  bVar1 = (byte)value;
  if (value < 0x80) {
    *buffer = bVar1 & 0x7f;
    buffer_local._4_4_ = 1;
  }
  else if (value < 0x800) {
    *buffer = (byte)((value & 0x7c0) >> 6) | 0xc0;
    buffer[1] = bVar1 & 0x3f | 0x80;
    buffer_local._4_4_ = 2;
  }
  else if (value < 0x10000) {
    *buffer = (byte)((value & 0xf000) >> 0xc) | 0xe0;
    buffer[1] = (byte)((value & 0xfc0) >> 6) | 0x80;
    buffer[2] = bVar1 & 0x3f | 0x80;
    buffer_local._4_4_ = 3;
  }
  else if (value < 0x110000) {
    *buffer = (byte)((value & 0x1c0000) >> 0x12) | 0xf0;
    buffer[1] = (byte)((value & 0x3f000) >> 0xc) | 0x80;
    buffer[2] = (byte)((value & 0xfc0) >> 6) | 0x80;
    buffer[3] = bVar1 & 0x3f | 0x80;
    buffer_local._4_4_ = 4;
  }
  else {
    buffer_local._4_4_ = 0;
  }
  return buffer_local._4_4_;
}

Assistant:

uint32_t utf8_encode(char *buffer, uint32_t value) {
    char *bytes = buffer;
    
    if (value <= 0x7f) {
        // single byte (i.e. fits in ASCII).
        *bytes = (char)(value & 0x7f);
        return 1;
    }
    
    if (value <= 0x7ff) {
        // two byte sequence: 110xxxxx 10xxxxxx.
        *bytes = (char)(0xc0 | ((value & 0x7c0) >> 6));
        ++bytes;
        *bytes = (char)(0x80 | (value & 0x3f));
        return 2;
    }
    
    if (value <= 0xffff) {
        // three byte sequence: 1110xxxx 10xxxxxx 10xxxxxx.
        *bytes = (char)(0xe0 | ((value & 0xf000) >> 12));
        ++bytes;
        *bytes = (char)(0x80 | ((value & 0xfc0) >> 6));
        ++bytes;
        *bytes = (char)(0x80 | (value & 0x3f));
        return 3;
    }
    
    if (value <= 0x10ffff) {
        // four byte sequence: 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx.
        *bytes = (char)(0xf0 | ((value & 0x1c0000) >> 18));
        ++bytes;
        *bytes = (char)(0x80 | ((value & 0x3f000) >> 12));
        ++bytes;
        *bytes = (char)(0x80 | ((value & 0xfc0) >> 6));
        ++bytes;
        *bytes = (char)(0x80 | (value & 0x3f));
        return 4;
    }
    
    return 0;
}